

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int lyxp_set_cast(lyxp_set *set,lyxp_set_type target,lyd_node *cur_node,lys_module *param_4,
                 int options)

{
  longdouble lVar1;
  char cVar2;
  lyxp_set_type lVar3;
  int iVar4;
  LY_ERR *pLVar5;
  undefined8 uVar6;
  char *str_00;
  char *pcVar7;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  long local_68;
  ushort uStack_60;
  char *local_40;
  char *str;
  
  if (set == (lyxp_set *)0x0) {
    return 0;
  }
  lVar3 = set->type;
  str_00 = (char *)(ulong)lVar3;
  if (lVar3 == target) {
    return 0;
  }
  if ((target == LYXP_SET_NODE_SET) || (target != LYXP_SET_EMPTY && lVar3 == LYXP_SET_SNODE_SET)) {
    __assert_fail("(target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1d21,
                  "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                 );
  }
  if (lVar3 == LYXP_SET_SNODE_SET) {
    free((set->val).nodes);
    return -1;
  }
  if (target != LYXP_SET_BOOLEAN) {
    if (target == LYXP_SET_STRING) {
code_r0x00167e7f:
      switch(lVar3) {
      case LYXP_SET_EMPTY:
        pcVar7 = strdup("");
        (set->val).str = pcVar7;
        if (pcVar7 == (char *)0x0) {
LAB_00167eaa:
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_set_cast");
          return -1;
        }
        goto LAB_00168028;
      case LYXP_SET_NODE_SET:
        if (set->used == 0) {
          __assert_fail("set->used",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                        ,0x1d4b,
                        "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                       );
        }
        iVar4 = set_sort(set,cur_node,options);
        if (1 < iVar4) {
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EINT;
          ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","lyxp_set_cast");
        }
        local_40 = cast_node_set_to_string(set,cur_node,param_4,options);
        if (local_40 == (char *)0x0) {
          return -1;
        }
        free((set->val).nodes);
        pcVar7 = local_40;
        str_00 = (char *)cur_node;
        goto LAB_00168024;
      default:
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        uVar6 = 0x1d63;
        goto LAB_001681b1;
      case LYXP_SET_BOOLEAN:
        if ((set->val).bool == 0) {
          pcVar7 = "false";
        }
        else {
          pcVar7 = "true";
        }
        break;
      case LYXP_SET_NUMBER:
        lVar1 = (set->val).num;
        if (NAN(lVar1)) {
          pcVar7 = "NaN";
        }
        else if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
          local_68 = SUB108(lVar1,0);
          uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
          if ((short)uStack_60 < 0 ||
              ((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000)) {
            if (((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000) ||
                -1 < (short)uStack_60) {
              str._4_2_ = in_FPUControlWord | 0xc00;
              if ((lVar1 != (longdouble)(long)ROUND(lVar1)) ||
                 (NAN(lVar1) || NAN((longdouble)(long)ROUND(lVar1)))) {
                str_00 = "%03.1Lf";
                iVar4 = asprintf(&local_40,"%03.1Lf");
              }
              else {
                str_00 = "%lld";
                iVar4 = asprintf(&local_40,"%lld");
              }
              pcVar7 = local_40;
              if (iVar4 == -1) goto LAB_00167eaa;
              goto LAB_00168024;
            }
            pcVar7 = "-Infinity";
          }
          else {
            pcVar7 = "Infinity";
          }
        }
        else {
          pcVar7 = "0";
        }
      }
      pcVar7 = strdup(pcVar7);
LAB_00168024:
      (set->val).str = pcVar7;
LAB_00168028:
      set->type = LYXP_SET_STRING;
LAB_00168031:
      if (target == LYXP_SET_BOOLEAN) goto LAB_001680b1;
      if (target == LYXP_SET_NUMBER) {
        if (set->type == LYXP_SET_BOOLEAN) {
          if ((set->val).bool == 0) {
            in_ST0 = (longdouble)0;
          }
          else {
            in_ST0 = (longdouble)1;
          }
        }
        else {
          if (set->type != LYXP_SET_STRING) {
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EINT;
            uVar6 = 0x1d79;
            goto LAB_001681b1;
          }
          cast_string_to_number((longdouble *)(set->val).nodes,str_00);
          free((set->val).nodes);
        }
        (set->val).num = in_ST0;
        set->type = LYXP_SET_NUMBER;
      }
    }
    else if (target == LYXP_SET_NUMBER) {
      if (lVar3 < LYXP_SET_SNODE_SET) goto code_r0x00167e7f;
      goto LAB_00168031;
    }
    goto LAB_00168141;
  }
LAB_001680b1:
  switch(set->type) {
  case LYXP_SET_EMPTY:
switchD_001680cc_caseD_0:
    (set->val).bool = 0;
    break;
  case LYXP_SET_NODE_SET:
    free((set->val).nodes);
    if (set->used == 0) {
      __assert_fail("set->used",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x1d95,
                    "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                   );
    }
    goto LAB_00168130;
  default:
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINT;
    uVar6 = 0x1d9c;
    goto LAB_001681b1;
  case LYXP_SET_NUMBER:
    if ((longdouble)0 == (set->val).num) goto switchD_001680cc_caseD_0;
    (set->val).bool = 1;
    break;
  case LYXP_SET_STRING:
    cVar2 = *(set->val).str;
    free((set->val).str);
    if (cVar2 == '\0') {
      (set->val).bool = 0;
      break;
    }
LAB_00168130:
    (set->val).bool = 1;
  }
  set->type = LYXP_SET_BOOLEAN;
LAB_00168141:
  if (target == LYXP_SET_EMPTY) {
    lVar3 = set->type;
    if (1 < lVar3 - LYXP_SET_BOOLEAN) {
      if ((lVar3 != LYXP_SET_NODE_SET) && (lVar3 != LYXP_SET_STRING)) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        uVar6 = 0x1db0;
LAB_001681b1:
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,uVar6);
        return -1;
      }
      free((set->val).nodes);
    }
    set->type = LYXP_SET_EMPTY;
  }
  return 0;
}

Assistant:

int
lyxp_set_cast(struct lyxp_set *set, enum lyxp_set_type target, const struct lyd_node *cur_node,
              const struct lys_module *local_mod, int options)
{
    long double num;
    char *str;

    if (!set || (set->type == target)) {
        return EXIT_SUCCESS;
    }

    /* it's not possible to convert anything into a node set */
    assert((target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_SNODE_SET) {
        free(set->val.snodes);
        return -1;
    }

    /* to STRING */
    if ((target == LYXP_SET_STRING) || ((target == LYXP_SET_NUMBER)
            && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)))) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if (isnan(set->val.num)) {
                set->val.str = strdup("NaN");
            } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
                set->val.str = strdup("0");
            } else if (isinf(set->val.num) && !signbit(set->val.num)) {
                set->val.str = strdup("Infinity");
            } else if (isinf(set->val.num) && signbit(set->val.num)) {
                set->val.str = strdup("-Infinity");
            } else if ((long long)set->val.num == set->val.num) {
                if (asprintf(&str, "%lld", (long long)set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            } else {
                if (asprintf(&str, "%03.1Lf", set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            }
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.str = strdup("true");
            } else {
                set->val.str = strdup("false");
            }
            break;
        case LYXP_SET_NODE_SET:
            assert(set->used);

#ifndef NDEBUG
            /* we need the set sorted, it affects the result */
            if (set_sort(set, cur_node, options) > 1) {
                LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
            }
#endif

            str = cast_node_set_to_string(set, (struct lyd_node *)cur_node, (struct lys_module *)local_mod, options);
            if (!str) {
                return -1;
            }
            free(set->val.nodes);
            set->val.str = str;
            break;
        case LYXP_SET_EMPTY:
            set->val.str = strdup("");
            if (!set->val.str) {
                LOGMEM;
                return -1;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_STRING;
    }

    /* to NUMBER */
    if (target == LYXP_SET_NUMBER) {
        switch (set->type) {
        case LYXP_SET_STRING:
            num = cast_string_to_number(set->val.str);
            free(set->val.str);
            set->val.num = num;
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.num = 1;
            } else {
                set->val.num = 0;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_NUMBER;
    }

    /* to BOOLEAN */
    if (target == LYXP_SET_BOOLEAN) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if ((set->val.num == 0) || (set->val.num == -0.0f) || isnan(set->val.num)) {
                set->val.bool = 0;
            } else {
                set->val.bool = 1;
            }
            break;
        case LYXP_SET_STRING:
            if (set->val.str[0]) {
                free(set->val.str);
                set->val.bool = 1;
            } else {
                free(set->val.str);
                set->val.bool = 0;
            }
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);

            assert(set->used);
            set->val.bool = 1;
            break;
        case LYXP_SET_EMPTY:
            set->val.bool = 0;
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_BOOLEAN;
    }

    /* to EMPTY */
    if (target == LYXP_SET_EMPTY) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
        case LYXP_SET_BOOLEAN:
            /* nothing to do */
            break;
        case LYXP_SET_STRING:
            free(set->val.str);
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_EMPTY;
    }

    return EXIT_SUCCESS;
}